

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyser.cpp
# Opt level: O0

void __thiscall SemanticAnalyser::addBuildInSymbols(SemanticAnalyser *this)

{
  allocator<char> *__u;
  allocator<char> *in_RDI;
  __single_object printSymbol;
  __single_object ifSymbol;
  TypeName *in_stack_ffffffffffffff18;
  FunctionSymbol *in_stack_ffffffffffffff20;
  unique_ptr<FunctionSymbol,_std::default_delete<FunctionSymbol>_> *this_00;
  unique_ptr<FunctionSymbol,_std::default_delete<FunctionSymbol>_> *in_stack_ffffffffffffff28;
  unique_ptr<Symbol,_std::default_delete<Symbol>_> *in_stack_ffffffffffffff30;
  allocator<char> *this_01;
  char *__s;
  _Head_base<0UL,_FunctionSymbol_*,_false> in_stack_ffffffffffffff60;
  allocator<char> local_91;
  TypeName *in_stack_ffffffffffffff70;
  char (*in_stack_ffffffffffffff78) [6];
  unique_ptr<Symbol,_std::default_delete<Symbol>_> *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff88;
  SymbolTable *in_stack_ffffffffffffff90;
  allocator<char> local_61;
  string local_60 [32];
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_18;
  undefined4 local_14;
  char local_10 [16];
  
  local_14 = 0;
  __s = local_10;
  std::make_unique<FunctionSymbol,char_const(&)[3],TypeName>
            ((char (*) [3])in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  std::unique_ptr<FunctionSymbol,_std::default_delete<FunctionSymbol>_>::operator->
            ((unique_ptr<FunctionSymbol,_std::default_delete<FunctionSymbol>_> *)0x179482);
  local_18 = 0;
  FunctionSymbol::addArgument(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  std::unique_ptr<FunctionSymbol,_std::default_delete<FunctionSymbol>_>::operator->
            ((unique_ptr<FunctionSymbol,_std::default_delete<FunctionSymbol>_> *)0x1794ac);
  local_28 = 0;
  FunctionSymbol::addArgument(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  std::unique_ptr<FunctionSymbol,_std::default_delete<FunctionSymbol>_>::operator->
            ((unique_ptr<FunctionSymbol,_std::default_delete<FunctionSymbol>_> *)0x1794d6);
  local_2c = 0;
  FunctionSymbol::addArgument(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  local_3c = 2;
  std::make_unique<FunctionSymbol,char_const(&)[6],TypeName>
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  std::unique_ptr<FunctionSymbol,_std::default_delete<FunctionSymbol>_>::operator->
            ((unique_ptr<FunctionSymbol,_std::default_delete<FunctionSymbol>_> *)0x179529);
  local_40 = 3;
  FunctionSymbol::addArgument(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff60._M_head_impl,__s,in_RDI);
  std::unique_ptr<Symbol,std::default_delete<Symbol>>::
  unique_ptr<FunctionSymbol,std::default_delete<FunctionSymbol>,void>
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  SymbolTable::addSymbol
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  std::unique_ptr<Symbol,_std::default_delete<Symbol>_>::~unique_ptr(in_stack_ffffffffffffff30);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator(&local_61);
  __u = in_RDI + 8;
  this_01 = &local_91;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff60._M_head_impl,__s,in_RDI);
  this_00 = (unique_ptr<FunctionSymbol,_std::default_delete<FunctionSymbol>_> *)
            &stack0xffffffffffffff60;
  std::unique_ptr<Symbol,std::default_delete<Symbol>>::
  unique_ptr<FunctionSymbol,std::default_delete<FunctionSymbol>,void>
            ((unique_ptr<Symbol,_std::default_delete<Symbol>_> *)this_01,
             (unique_ptr<FunctionSymbol,_std::default_delete<FunctionSymbol>_> *)__u);
  SymbolTable::addSymbol
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  std::unique_ptr<Symbol,_std::default_delete<Symbol>_>::~unique_ptr
            ((unique_ptr<Symbol,_std::default_delete<Symbol>_> *)this_01);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
  std::allocator<char>::~allocator(&local_91);
  std::unique_ptr<FunctionSymbol,_std::default_delete<FunctionSymbol>_>::~unique_ptr(this_00);
  std::unique_ptr<FunctionSymbol,_std::default_delete<FunctionSymbol>_>::~unique_ptr(this_00);
  return;
}

Assistant:

void SemanticAnalyser::addBuildInSymbols()
{
  auto ifSymbol = std::make_unique<FunctionSymbol>("if", TypeName::F32);
  ifSymbol->addArgument(TypeName::F32);
  ifSymbol->addArgument(TypeName::F32);
  ifSymbol->addArgument(TypeName::F32);

  auto printSymbol = std::make_unique<FunctionSymbol>("print", TypeName::Void);
  printSymbol->addArgument(TypeName::String);

  symbols_.addSymbol("if", std::move(ifSymbol));
  symbols_.addSymbol("print", std::move(printSymbol));
}